

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

longlong __thiscall mkvparser::Cluster::GetFirstTime(Cluster *this)

{
  long lVar1;
  int iVar2;
  longlong lVar3;
  undefined4 extraout_var;
  longlong lVar4;
  BlockEntry *pEntry;
  BlockEntry *local_10;
  
  lVar3 = GetFirst(this,&local_10);
  if (-1 < lVar3) {
    if (local_10 == (BlockEntry *)0x0) {
      lVar3 = GetTime(this);
      return lVar3;
    }
    iVar2 = (*local_10->_vptr_BlockEntry[2])();
    lVar4 = Block::GetTimeCode((Block *)CONCAT44(extraout_var,iVar2),this);
    lVar1 = this->m_pSegment->m_pInfo->m_timecodeScale;
    if ((lVar4 == 0) ||
       (lVar3 = -1,
       lVar1 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar4),0))) {
      lVar3 = lVar1 * lVar4;
    }
  }
  return lVar3;
}

Assistant:

long long Cluster::GetFirstTime() const {
  const BlockEntry* pEntry;

  const long status = GetFirst(pEntry);

  if (status < 0)  // error
    return status;

  if (pEntry == NULL)  // empty cluster
    return GetTime();

  const Block* const pBlock = pEntry->GetBlock();
  assert(pBlock);

  return pBlock->GetTime(this);
}